

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void flatview_add_to_dispatch_aarch64
               (uc_struct_conflict2 *uc,FlatView *fv,MemoryRegionSection *section)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 a_03 [16];
  uint16_t leaf;
  uint64_t nb;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  undefined1 in_stack_ffffffffffffff08 [14];
  undefined2 in_stack_ffffffffffffff16;
  MemoryRegionSection local_d8;
  ulong local_90;
  ulong local_88;
  AddressSpaceDispatch *local_80;
  MemoryRegionSection local_78;
  
  uVar1 = (ulong)section->size;
  uVar2 = *(ulong *)((long)&section->size + 8);
  local_d8.mr = section->mr;
  local_d8.fv = section->fv;
  local_d8.offset_within_region = section->offset_within_region;
  uVar4 = section->offset_within_address_space;
  local_d8.readonly = section->readonly;
  local_d8._49_7_ = *(undefined7 *)&section->field_0x31;
  local_d8._56_8_ = *(undefined8 *)&section->field_0x38;
  uVar3 = uc->init_target_page->mask;
  uVar5 = (ulong)-(int)uVar3;
  local_d8.size._0_8_ = uVar1;
  local_d8.size._8_8_ = uVar2;
  local_d8.offset_within_address_space = uVar4;
  if ((uVar4 & ~uVar3) != 0) {
    uVar1 = (-uVar5 & (uVar5 + uVar4) - 1) - uVar4;
    uVar3 = (ulong)section->size;
    uVar2 = *(ulong *)((long)&section->size + 8);
    local_78.mr = section->mr;
    local_78.fv = section->fv;
    local_78.offset_within_region = section->offset_within_region;
    local_78.offset_within_address_space = section->offset_within_address_space;
    local_78.readonly = section->readonly;
    local_78._49_7_ = *(undefined7 *)&section->field_0x31;
    local_78._56_8_ = *(undefined8 *)&section->field_0x38;
    if ((long)-uVar2 < (long)(ulong)(uVar1 < uVar3)) {
      uVar2 = 0;
      uVar3 = uVar1;
    }
    local_78.size._0_8_ = uVar3;
    local_78.size._8_8_ = uVar2;
    register_subpage(uc,fv,&local_78);
    if (local_d8.size._8_8_ == uVar2 && (ulong)local_d8.size == uVar3) {
      return;
    }
    uVar1 = (ulong)local_d8.size - uVar3;
    uVar2 = (local_d8.size._8_8_ - uVar2) - (ulong)((ulong)local_d8.size < uVar3);
    a._14_2_ = in_stack_ffffffffffffff16;
    a._0_14_ = in_stack_ffffffffffffff08;
    local_d8.size._0_8_ = uVar1;
    local_d8.size._8_8_ = uVar2;
    int128_get64((Int128)a);
    uVar4 = uVar4 + uVar3;
    a_00._14_2_ = in_stack_ffffffffffffff16;
    a_00._0_14_ = in_stack_ffffffffffffff08;
    local_d8.offset_within_address_space = uVar4;
    int128_get64((Int128)a_00);
    local_d8.offset_within_region = local_d8.offset_within_region + uVar3;
  }
  if ((long)(ulong)(uVar1 < uVar5) <= (long)uVar2) {
    local_78.readonly = local_d8.readonly;
    local_78._49_7_ = local_d8._49_7_;
    local_78._56_8_ = local_d8._56_8_;
    local_78.offset_within_region = local_d8.offset_within_region;
    local_78.offset_within_address_space = local_d8.offset_within_address_space;
    uVar3 = -(ulong)(uVar5 != 0) & local_d8.size._8_8_;
    local_78.mr = local_d8.mr;
    local_78.fv = local_d8.fv;
    uVar5 = -uVar5 & (ulong)local_d8.size;
    local_80 = fv->dispatch;
    local_88 = local_d8.offset_within_address_space;
    local_90 = uVar4;
    local_78.size._0_8_ = uVar5;
    local_78.size._8_8_ = uVar3;
    leaf = phys_section_add(uc,&local_80->map,&local_78);
    nb = __ashrti3(uVar5,uVar3,(char)uc->init_target_page->bits);
    a_01._14_2_ = leaf;
    a_01._0_14_ = in_stack_ffffffffffffff08;
    int128_get64((Int128)a_01);
    if (nb == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_80,local_88 >> ((byte)uc->init_target_page->bits & 0x3f),nb,leaf);
    uVar4 = local_90;
    if (uVar2 == uVar3 && uVar1 == uVar5) {
      return;
    }
    local_d8.size._0_8_ = uVar1 - uVar5;
    local_d8.size._8_8_ = (uVar2 - uVar3) - (ulong)(uVar1 < uVar5);
    a_02._14_2_ = leaf;
    a_02._0_14_ = in_stack_ffffffffffffff08;
    int128_get64((Int128)a_02);
    local_d8.offset_within_address_space = uVar4 + uVar5;
    a_03._14_2_ = leaf;
    a_03._0_14_ = in_stack_ffffffffffffff08;
    int128_get64((Int128)a_03);
    local_d8.offset_within_region = local_d8.offset_within_region + uVar5;
  }
  register_subpage(uc,fv,&local_d8);
  return;
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}